

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O3

float deqp::gles3::Functional::addErrorUlp(float value,float numUlps,int numMantissaBits)

{
  int iVar1;
  int iVar2;
  float fVar3;
  
  iVar2 = ((uint)value >> 0x17 & 0xff) - 0x7f;
  iVar1 = -0x7e;
  if (((uint)value & 0x7fffff) == 0) {
    iVar1 = iVar2;
  }
  if (((uint)value & 0x7f800000) != 0) {
    iVar1 = iVar2;
  }
  if (numMantissaBits < 1) {
    fVar3 = (float)(iVar1 * 0x800000 + 0x3f800000);
  }
  else {
    fVar3 = (float)(iVar1 * 0x800000 + (1 << (0x17U - (char)numMantissaBits & 0x1f) & 0x7fffffU) +
                   0x3f800000) - (float)(iVar1 * 0x800000 + 0x3f800000);
  }
  return numUlps * fVar3 + value;
}

Assistant:

inline Float<StorageType, ExponentBits, MantissaBits, ExponentBias, Flags>::Float (float value)
	: m_value(0)
{
	deUint32 u32;
	memcpy(&u32, &value, sizeof(deUint32));
	*this = convert(Float32(u32));
}